

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,char *value,char *helpString,CacheEntryType type)

{
  size_type sVar1;
  mapped_type *this_00;
  long lVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *i;
  _Alloc_hider path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string local_58;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  if (value == (char *)0x0) {
    (this_00->Value)._M_string_length = 0;
    *(this_00->Value)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar3 = (char *)(this_00->Value)._M_string_length;
    strlen(value);
    std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar3,(ulong)value);
    this_00->Initialized = true;
  }
  this_00->Type = type;
  if (type - PATH < 2) {
    lVar2 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar2 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      cmSystemTools::ExpandListArgument
                (&this_00->Value,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,false);
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this_00->Value)._M_string_length,0x518362);
      sVar1 = local_58._M_string_length;
      for (path._M_p = local_58._M_dataplus._M_p; path._M_p != (pointer)sVar1;
          path._M_p = path._M_p + 0x20) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)path._M_p);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::_M_append
                  ((char *)this_00,(ulong)(((string *)path._M_p)->_M_dataplus)._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"HELPSTRING","");
  pcVar3 = "(This variable does not exist and should not be used)";
  if (helpString != (char *)0x0) {
    pcVar3 = helpString;
  }
  CacheEntry::SetProperty(this_00,&local_58,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key, const char* value,
                                   const char* helpString,
                                   cmStateEnums::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  if (value) {
    e.Value = value;
    e.Initialized = true;
  } else {
    e.Value.clear();
  }
  e.Type = type;
  // make sure we only use unix style paths
  if (type == cmStateEnums::FILEPATH || type == cmStateEnums::PATH) {
    if (e.Value.find(';') != std::string::npos) {
      std::vector<std::string> paths;
      cmSystemTools::ExpandListArgument(e.Value, paths);
      const char* sep = "";
      e.Value = "";
      for (std::string& i : paths) {
        cmSystemTools::ConvertToUnixSlashes(i);
        e.Value += sep;
        e.Value += i;
        sep = ";";
      }
    } else {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
    }
  }
  e.SetProperty("HELPSTRING",
                helpString
                  ? helpString
                  : "(This variable does not exist and should not be used)");
}